

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<ki::protocol::net::PacketHeader> * __thiscall
pybind11::class_<ki::protocol::net::PacketHeader>::
def_property_readonly<unsigned_long(ki::protocol::net::PacketHeader::*)()const,pybind11::return_value_policy>
          (class_<ki::protocol::net::PacketHeader> *this,char *name,offset_in_Message_to_subr *fget,
          return_value_policy *extra)

{
  class_<ki::protocol::net::PacketHeader> *pcVar1;
  return_value_policy local_29;
  cpp_function local_28;
  
  cpp_function::cpp_function<unsigned_long,ki::protocol::net::PacketHeader>(&local_28,*fget);
  local_29 = reference_internal;
  pcVar1 = def_property_readonly<pybind11::return_value_policy,pybind11::return_value_policy>
                     (this,name,&local_28,&local_29,extra);
  object::~object((object *)&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }